

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error epilogProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  int iVar1;
  char *next;
  char *local_30;
  
  *(code **)((long)parser + 0x208) = epilogProcessor;
  *(char **)((long)parser + 0x218) = s;
  do {
    iVar1 = (*(code *)**(undefined8 **)((long)parser + 0x118))
                      (*(undefined8 **)((long)parser + 0x118),s,end,&local_30);
    *(char **)((long)parser + 0x220) = local_30;
    if (iVar1 < 0xd) {
      if (iVar1 != 0xb) {
        switch(iVar1) {
        case 0:
          *(char **)((long)parser + 0x218) = local_30;
          return XML_ERROR_INVALID_TOKEN;
        case -3:
          return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
        case -2:
          if (nextPtr == (char **)0x0) {
            return XML_ERROR_PARTIAL_CHAR;
          }
          break;
        case -1:
          if (nextPtr == (char **)0x0) {
            return XML_ERROR_UNCLOSED_TOKEN;
          }
          break;
        default:
          if (iVar1 != -0xf) {
            return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
          }
          if (*(long *)((long)parser + 0xa0) != 0) {
            *(char **)((long)parser + 0x220) = end;
            reportDefault(parser,*(ENCODING **)((long)parser + 0x118),s,end);
          }
        case -4:
          if (nextPtr == (char **)0x0) {
            return XML_ERROR_NONE;
          }
          *nextPtr = end;
          return XML_ERROR_NONE;
        }
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      iVar1 = reportProcessingInstruction(parser,*(ENCODING **)((long)parser + 0x118),s,local_30);
LAB_004c5df2:
      if (iVar1 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
    }
    else {
      if (iVar1 == 0xd) {
        iVar1 = reportComment(parser,*(ENCODING **)((long)parser + 0x118),s,local_30);
        goto LAB_004c5df2;
      }
      if (iVar1 != 0xf) {
        return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
      }
      if (*(long *)((long)parser + 0xa0) != 0) {
        reportDefault(parser,*(ENCODING **)((long)parser + 0x118),s,local_30);
      }
    }
    *(char **)((long)parser + 0x218) = local_30;
    s = local_30;
  } while( true );
}

Assistant:

static
enum XML_Error epilogProcessor(XML_Parser parser,
                               const char *s,
                               const char *end,
                               const char **nextPtr)
{
  processor = epilogProcessor;
  eventPtr = s;
  for (;;) {
    const char *next;
    int tok = XmlPrologTok(encoding, s, end, &next);
    eventEndPtr = next;
    switch (tok) {
    case -XML_TOK_PROLOG_S:
      if (defaultHandler) {
        eventEndPtr = end;
        reportDefault(parser, encoding, s, end);
      }
      /* fall through */
    case XML_TOK_NONE:
      if (nextPtr)
        *nextPtr = end;
      return XML_ERROR_NONE;
    case XML_TOK_PROLOG_S:
      if (defaultHandler)
        reportDefault(parser, encoding, s, next);
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_INVALID:
      eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    default:
      return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
    }
    eventPtr = s = next;
  }
}